

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttcolr.c
# Opt level: O1

FT_Error tt_face_colr_blend_layer
                   (TT_Face face,FT_UInt color_index,FT_GlyphSlot dstSlot,FT_GlyphSlot srcSlot)

{
  FT_UInt *pFVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  FT_Color *pFVar9;
  FT_UShort *pFVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  bool bVar14;
  uchar *puVar15;
  byte bVar16;
  int iVar17;
  uint uVar18;
  int iVar19;
  FT_Byte *__dest;
  byte bVar20;
  int iVar21;
  int iVar22;
  uint uVar23;
  int iVar24;
  uchar *puVar25;
  uint uVar26;
  ulong uVar27;
  uint uVar28;
  int iVar29;
  uint uVar30;
  FT_Error error;
  int local_64;
  FT_Int local_60;
  undefined4 uStack_5c;
  TT_Face local_58;
  FT_GlyphSlot local_50;
  uint local_48;
  FT_Error local_44;
  FT_Byte *local_40;
  
  if ((dstSlot->bitmap).buffer == (uchar *)0x0) {
    dstSlot->bitmap_left = srcSlot->bitmap_left;
    dstSlot->bitmap_top = srcSlot->bitmap_top;
    uVar23 = (srcSlot->bitmap).width;
    (dstSlot->bitmap).width = uVar23;
    uVar28 = (srcSlot->bitmap).rows;
    (dstSlot->bitmap).rows = uVar28;
    (dstSlot->bitmap).pixel_mode = '\a';
    iVar19 = uVar23 * 4;
    (dstSlot->bitmap).pitch = iVar19;
    (dstSlot->bitmap).num_grays = 0x100;
    uVar27 = (ulong)(iVar19 * uVar28);
    local_64 = ft_glyphslot_alloc_bitmap(dstSlot,uVar27);
    if (local_64 != 0) {
      return local_64;
    }
    memset((dstSlot->bitmap).buffer,0,uVar27);
  }
  else {
    iVar19 = dstSlot->bitmap_left;
    iVar6 = dstSlot->bitmap_top;
    iVar24 = (dstSlot->bitmap).width + iVar19;
    iVar7 = srcSlot->bitmap_left;
    iVar8 = srcSlot->bitmap_top;
    iVar21 = iVar6 - (dstSlot->bitmap).rows;
    iVar29 = (srcSlot->bitmap).width + iVar7;
    iVar22 = iVar8 - (srcSlot->bitmap).rows;
    iVar17 = iVar22;
    if (iVar21 < iVar22) {
      iVar17 = iVar21;
    }
    iVar11 = iVar8;
    if (iVar8 < iVar6) {
      iVar11 = iVar6;
    }
    iVar12 = iVar7;
    if (iVar19 < iVar7) {
      iVar12 = iVar19;
    }
    iVar13 = iVar29;
    if (iVar29 < iVar24) {
      iVar13 = iVar24;
    }
    if ((iVar24 < iVar29 || iVar7 < iVar19) || (iVar8 > iVar6 || iVar22 < iVar21)) {
      uVar28 = iVar11 - iVar17;
      uVar23 = (iVar13 - iVar12) * 4;
      local_58 = face;
      local_40 = (FT_Byte *)ft_mem_alloc((face->root).memory,(ulong)(uVar28 * uVar23),&local_64);
      if (local_64 == 0) {
        local_44 = local_64;
        _local_60 = CONCAT44(uStack_5c,iVar12);
        local_50 = srcSlot;
        local_48 = uVar28;
        if ((dstSlot->bitmap).rows != 0) {
          __dest = local_40 +
                   ((long)dstSlot->bitmap_left - (long)iVar12) * 4 +
                   (long)(int)((iVar11 - dstSlot->bitmap_top) * uVar23);
          puVar15 = (dstSlot->bitmap).buffer;
          uVar28 = 0;
          do {
            memcpy(__dest,puVar15,(ulong)((dstSlot->bitmap).width << 2));
            puVar15 = puVar15 + (dstSlot->bitmap).pitch;
            __dest = __dest + uVar23;
            uVar28 = uVar28 + 1;
          } while (uVar28 < (dstSlot->bitmap).rows);
        }
        ft_glyphslot_set_bitmap(dstSlot,local_40);
        dstSlot->bitmap_top = iVar11;
        dstSlot->bitmap_left = local_60;
        (dstSlot->bitmap).width = iVar13 - iVar12;
        (dstSlot->bitmap).rows = local_48;
        (dstSlot->bitmap).pitch = uVar23;
        pFVar1 = &dstSlot->internal->flags;
        *pFVar1 = *pFVar1 | 1;
        dstSlot->format = FT_GLYPH_FORMAT_BITMAP;
        bVar14 = true;
        srcSlot = local_50;
        face = local_58;
        local_64 = local_44;
      }
      else {
        bVar14 = false;
        face = local_58;
      }
    }
    else {
      bVar14 = true;
      local_64 = CONCAT31((int3)((uint)iVar6 >> 8),iVar8 <= iVar6);
    }
    if (!bVar14) {
      return local_64;
    }
  }
  if (color_index == 0xffff) {
    if (face->have_foreground_color == '\0') {
      pFVar10 = (face->palette_data).palette_flags;
      if (pFVar10 != (FT_UShort *)0x0) {
        bVar16 = 0xff;
        uVar28 = 0xff;
        uVar23 = 0xff;
        bVar20 = 0xff;
        if ((pFVar10[face->palette_index] & 2) != 0) goto LAB_0024ca2b;
      }
      bVar16 = 0xff;
      uVar28 = 0;
      uVar23 = 0;
      bVar20 = 0;
    }
    else {
      bVar20 = (face->foreground_color).blue;
      uVar23 = (uint)(face->foreground_color).green;
      uVar28 = (uint)(face->foreground_color).red;
      bVar16 = (face->foreground_color).alpha;
    }
  }
  else {
    pFVar9 = face->palette;
    bVar20 = pFVar9[color_index].blue;
    uVar23 = (uint)pFVar9[color_index].green;
    uVar28 = (uint)pFVar9[color_index].red;
    bVar16 = pFVar9[color_index].alpha;
  }
LAB_0024ca2b:
  if ((srcSlot->bitmap).rows != 0) {
    puVar15 = (dstSlot->bitmap).buffer +
              ((long)srcSlot->bitmap_left - (long)dstSlot->bitmap_left) * 4 +
              (long)(dstSlot->bitmap).pitch *
              ((long)dstSlot->bitmap_top - (long)srcSlot->bitmap_top);
    puVar25 = (srcSlot->bitmap).buffer;
    uVar18 = 0;
    do {
      if ((srcSlot->bitmap).width != 0) {
        uVar26 = 3;
        uVar27 = 0;
        do {
          bVar2 = puVar25[uVar27];
          uVar30 = ((uint)bVar2 * (uint)bVar16) / 0xff;
          iVar19 = 0xff - uVar30;
          bVar3 = puVar15[uVar26 - 2];
          bVar4 = puVar15[uVar26 - 1];
          bVar5 = puVar15[uVar26];
          puVar15[uVar26 - 3] =
               (char)((ulong)((uint)puVar15[uVar26 - 3] * iVar19) * 0x1010102 >> 0x20) +
               (char)((ulong)(uVar30 * bVar20) * 0x1010102 >> 0x20);
          puVar15[uVar26 - 2] =
               (char)((ulong)((uint)bVar3 * iVar19) * 0x1010102 >> 0x20) +
               (char)((ulong)(uVar30 * uVar23) * 0x1010102 >> 0x20);
          puVar15[uVar26 - 1] =
               (char)((ulong)((uint)bVar4 * iVar19) * 0x1010102 >> 0x20) +
               (char)((ulong)(uVar30 * uVar28) * 0x1010102 >> 0x20);
          puVar15[uVar26] =
               (char)((ulong)((uint)bVar5 * iVar19) * 0x1010102 >> 0x20) +
               (char)((ulong)((uint)bVar2 * (uint)bVar16) * 0x1010102 >> 0x20);
          uVar27 = uVar27 + 1;
          uVar26 = uVar26 + 4;
        } while (uVar27 < (srcSlot->bitmap).width);
      }
      puVar25 = puVar25 + (srcSlot->bitmap).pitch;
      puVar15 = puVar15 + (dstSlot->bitmap).pitch;
      uVar18 = uVar18 + 1;
    } while (uVar18 < (srcSlot->bitmap).rows);
  }
  return 0;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  tt_face_colr_blend_layer( TT_Face       face,
                            FT_UInt       color_index,
                            FT_GlyphSlot  dstSlot,
                            FT_GlyphSlot  srcSlot )
  {
    FT_Error  error;

    FT_UInt  x, y;
    FT_Byte  b, g, r, alpha;

    FT_ULong  size;
    FT_Byte*  src;
    FT_Byte*  dst;


    if ( !dstSlot->bitmap.buffer )
    {
      /* Initialize destination of color bitmap */
      /* with the size of first component.      */
      dstSlot->bitmap_left = srcSlot->bitmap_left;
      dstSlot->bitmap_top  = srcSlot->bitmap_top;

      dstSlot->bitmap.width      = srcSlot->bitmap.width;
      dstSlot->bitmap.rows       = srcSlot->bitmap.rows;
      dstSlot->bitmap.pixel_mode = FT_PIXEL_MODE_BGRA;
      dstSlot->bitmap.pitch      = (int)dstSlot->bitmap.width * 4;
      dstSlot->bitmap.num_grays  = 256;

      size = dstSlot->bitmap.rows * (unsigned int)dstSlot->bitmap.pitch;

      error = ft_glyphslot_alloc_bitmap( dstSlot, size );
      if ( error )
        return error;

      FT_MEM_ZERO( dstSlot->bitmap.buffer, size );
    }
    else
    {
      /* Resize destination if needed such that new component fits. */
      FT_Int  x_min, x_max, y_min, y_max;


      x_min = FT_MIN( dstSlot->bitmap_left, srcSlot->bitmap_left );
      x_max = FT_MAX( dstSlot->bitmap_left + (FT_Int)dstSlot->bitmap.width,
                      srcSlot->bitmap_left + (FT_Int)srcSlot->bitmap.width );

      y_min = FT_MIN( dstSlot->bitmap_top - (FT_Int)dstSlot->bitmap.rows,
                      srcSlot->bitmap_top - (FT_Int)srcSlot->bitmap.rows );
      y_max = FT_MAX( dstSlot->bitmap_top, srcSlot->bitmap_top );

      if ( x_min != dstSlot->bitmap_left                                 ||
           x_max != dstSlot->bitmap_left + (FT_Int)dstSlot->bitmap.width ||
           y_min != dstSlot->bitmap_top - (FT_Int)dstSlot->bitmap.rows   ||
           y_max != dstSlot->bitmap_top                                  )
      {
        FT_Memory  memory = face->root.memory;

        FT_UInt  width = (FT_UInt)( x_max - x_min );
        FT_UInt  rows  = (FT_UInt)( y_max - y_min );
        FT_UInt  pitch = width * 4;

        FT_Byte*  buf = NULL;
        FT_Byte*  p;
        FT_Byte*  q;


        size  = rows * pitch;
        if ( FT_ALLOC( buf, size ) )
          return error;

        p = dstSlot->bitmap.buffer;
        q = buf +
            (int)pitch * ( y_max - dstSlot->bitmap_top ) +
            4 * ( dstSlot->bitmap_left - x_min );

        for ( y = 0; y < dstSlot->bitmap.rows; y++ )
        {
          FT_MEM_COPY( q, p, dstSlot->bitmap.width * 4 );

          p += dstSlot->bitmap.pitch;
          q += pitch;
        }

        ft_glyphslot_set_bitmap( dstSlot, buf );

        dstSlot->bitmap_top  = y_max;
        dstSlot->bitmap_left = x_min;

        dstSlot->bitmap.width = width;
        dstSlot->bitmap.rows  = rows;
        dstSlot->bitmap.pitch = (int)pitch;

        dstSlot->internal->flags |= FT_GLYPH_OWN_BITMAP;
        dstSlot->format           = FT_GLYPH_FORMAT_BITMAP;
      }
    }

    if ( color_index == 0xFFFF )
    {
      if ( face->have_foreground_color )
      {
        b     = face->foreground_color.blue;
        g     = face->foreground_color.green;
        r     = face->foreground_color.red;
        alpha = face->foreground_color.alpha;
      }
      else
      {
        if ( face->palette_data.palette_flags                          &&
             ( face->palette_data.palette_flags[face->palette_index] &
                 FT_PALETTE_FOR_DARK_BACKGROUND                      ) )
        {
          /* white opaque */
          b     = 0xFF;
          g     = 0xFF;
          r     = 0xFF;
          alpha = 0xFF;
        }
        else
        {
          /* black opaque */
          b     = 0x00;
          g     = 0x00;
          r     = 0x00;
          alpha = 0xFF;
        }
      }
    }
    else
    {
      b     = face->palette[color_index].blue;
      g     = face->palette[color_index].green;
      r     = face->palette[color_index].red;
      alpha = face->palette[color_index].alpha;
    }

    /* XXX Convert if srcSlot.bitmap is not grey? */
    src = srcSlot->bitmap.buffer;
    dst = dstSlot->bitmap.buffer +
          dstSlot->bitmap.pitch * ( dstSlot->bitmap_top - srcSlot->bitmap_top ) +
          4 * ( srcSlot->bitmap_left - dstSlot->bitmap_left );

    for ( y = 0; y < srcSlot->bitmap.rows; y++ )
    {
      for ( x = 0; x < srcSlot->bitmap.width; x++ )
      {
        int  aa = src[x];
        int  fa = alpha * aa / 255;

        int  fb = b * fa / 255;
        int  fg = g * fa / 255;
        int  fr = r * fa / 255;

        int  ba2 = 255 - fa;

        int  bb = dst[4 * x + 0];
        int  bg = dst[4 * x + 1];
        int  br = dst[4 * x + 2];
        int  ba = dst[4 * x + 3];


        dst[4 * x + 0] = (FT_Byte)( bb * ba2 / 255 + fb );
        dst[4 * x + 1] = (FT_Byte)( bg * ba2 / 255 + fg );
        dst[4 * x + 2] = (FT_Byte)( br * ba2 / 255 + fr );
        dst[4 * x + 3] = (FT_Byte)( ba * ba2 / 255 + fa );
      }

      src += srcSlot->bitmap.pitch;
      dst += dstSlot->bitmap.pitch;
    }

    return FT_Err_Ok;
  }